

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comoment_suite.cpp
# Opt level: O0

void api_suite::test_size(void)

{
  undefined4 local_bc;
  size_type local_b8;
  undefined4 local_ac;
  size_type local_a8;
  undefined4 local_9c;
  size_type local_98;
  undefined4 local_8c;
  size_type local_88;
  undefined4 local_7c;
  size_type local_78;
  undefined4 local_6c;
  size_type local_68 [2];
  undefined1 local_58 [8];
  covariance<double,_4> filter;
  
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::basic_comoment
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_68[0] = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::size
                          ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x42,"void api_suite::test_size()",local_68,&local_6c);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,1.0,1.0);
  local_78 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::size
                       ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_7c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x44,"void api_suite::test_size()",&local_78,&local_7c);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,2.0,2.0);
  local_88 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::size
                       ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_8c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x46,"void api_suite::test_size()",&local_88,&local_8c);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,3.0,3.0);
  local_98 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::size
                       ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_9c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x48,"void api_suite::test_size()",&local_98,&local_9c);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,4.0,4.0);
  local_a8 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::size
                       ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_ac = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x4a,"void api_suite::test_size()",&local_a8,&local_ac);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,5.0,5.0);
  local_b8 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::size
                       ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_bc = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x4c,"void api_suite::test_size()",&local_b8,&local_bc);
  return;
}

Assistant:

void test_size()
{
    interim::covariance<double, 4> filter;
    TRIAL_TEST_EQ(filter.size(), 0);
    filter.push(1.0, 1.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.size(), 2);
    filter.push(3.0, 3.0);
    TRIAL_TEST_EQ(filter.size(), 3);
    filter.push(4.0, 4.0);
    TRIAL_TEST_EQ(filter.size(), 4);
    filter.push(5.0, 5.0);
    TRIAL_TEST_EQ(filter.size(), 4);
}